

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddTimeOperator,bool>
               (dtime_t *ldata,interval_t *rdata,dtime_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  interval_t right;
  bool bVar1;
  dtime_t dVar2;
  idx_t iVar3;
  interval_t *piVar4;
  SelectionVector *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  TemplatedValidityMask<unsigned_long> *in_stack_00000010;
  interval_t rentry_1;
  dtime_t lentry_1;
  idx_t i_1;
  interval_t rentry;
  dtime_t lentry;
  idx_t rindex;
  idx_t lindex;
  idx_t i;
  idx_t in_stack_ffffffffffffff28;
  long lVar5;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff30;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff38;
  idx_t in_stack_ffffffffffffff40;
  ValidityMask *in_stack_ffffffffffffff48;
  dtime_t in_stack_ffffffffffffff50;
  undefined1 fun_00;
  undefined8 in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  dtime_t in_stack_ffffffffffffff68;
  ulong local_90;
  ulong local_40;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar1) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000010), bVar1))
  {
    for (local_90 = 0; fun_00 = (undefined1)((ulong)in_stack_ffffffffffffff50.micros >> 0x38),
        local_90 < in_R9; local_90 = local_90 + 1) {
      lVar5 = in_RDI;
      iVar3 = SelectionVector::get_index(in_RCX,local_90);
      dVar2.micros = *(int64_t *)(lVar5 + iVar3 * 8);
      lVar5 = in_RSI;
      iVar3 = SelectionVector::get_index(in_R8,local_90);
      piVar4 = (interval_t *)(lVar5 + iVar3 * 0x10);
      in_stack_ffffffffffffff50 =
           BinaryStandardOperatorWrapper::
           Operation<bool,duckdb::AddTimeOperator,duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>
                     ((bool)fun_00,dVar2,*piVar4,dVar2,piVar4->micros);
      *(int64_t *)(in_RDX + local_90 * 8) = in_stack_ffffffffffffff50.micros;
    }
  }
  else {
    for (local_40 = 0; local_40 < in_R9; local_40 = local_40 + 1) {
      SelectionVector::get_index(in_RCX,local_40);
      SelectionVector::get_index(in_R8,local_40);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff38,(idx_t)in_stack_ffffffffffffff30);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (in_stack_ffffffffffffff38,(idx_t)in_stack_ffffffffffffff30), bVar1)) {
        right.micros = in_stack_ffffffffffffff60;
        right.months = (int)in_stack_ffffffffffffff58;
        right.days = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
        dVar2 = BinaryStandardOperatorWrapper::
                Operation<bool,duckdb::AddTimeOperator,duckdb::dtime_t,duckdb::interval_t,duckdb::dtime_t>
                          (SUB81((ulong)in_stack_ffffffffffffff50.micros >> 0x38,0),
                           in_stack_ffffffffffffff68,right,in_stack_ffffffffffffff48,
                           in_stack_ffffffffffffff40);
        *(int64_t *)(in_RDX + local_40 * 8) = dVar2.micros;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}